

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O3

void __thiscall
slang::Bag::set<slang::parsing::PreprocessorOptions&>(Bag *this,PreprocessorOptions *item)

{
  long lVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  char *__s2;
  uint uVar5;
  undefined1 auVar6 [16];
  byte bVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  value_type_pointer ppVar11;
  ulong pos0;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong hash;
  undefined1 auVar16 [16];
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  byte bVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  byte bVar32;
  locator res;
  try_emplace_args_t local_b1;
  type_index local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  size_t local_88;
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
  *local_80;
  value_type_pointer local_78;
  PreprocessorOptions *local_70;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_b0._M_target = (type_info *)&parsing::PreprocessorOptions::typeinfo;
  local_70 = item;
  sVar10 = std::type_info::hash_code((type_info *)&parsing::PreprocessorOptions::typeinfo);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar10;
  hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  pos0 = hash >> ((byte)(this->items).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        .arrays.groups_size_index & 0x3f);
  pgVar3 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_;
  lVar1 = (hash & 0xff) * 4;
  uVar17 = (&UNK_0048f58c)[lVar1];
  uVar18 = (&UNK_0048f58d)[lVar1];
  uVar19 = (&UNK_0048f58e)[lVar1];
  bVar20 = (&UNK_0048f58f)[lVar1];
  ppVar4 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.elements_;
  uVar15 = (uint)hash;
  sVar10 = (this->items).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
           .arrays.groups_size_mask;
  uVar13 = 0;
  uVar14 = pos0;
  uVar21 = uVar17;
  uVar22 = uVar18;
  uVar23 = uVar19;
  bVar24 = bVar20;
  uVar25 = uVar17;
  uVar26 = uVar18;
  uVar27 = uVar19;
  bVar28 = bVar20;
  uVar29 = uVar17;
  uVar30 = uVar18;
  uVar31 = uVar19;
  bVar32 = bVar20;
  do {
    pgVar2 = pgVar3 + uVar14;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bVar7 = pgVar2->m[0xf].n;
    auVar16[0] = -(local_58 == uVar17);
    auVar16[1] = -(uStack_57 == uVar18);
    auVar16[2] = -(uStack_56 == uVar19);
    auVar16[3] = -(bStack_55 == bVar20);
    auVar16[4] = -(uStack_54 == uVar21);
    auVar16[5] = -(uStack_53 == uVar22);
    auVar16[6] = -(uStack_52 == uVar23);
    auVar16[7] = -(bStack_51 == bVar24);
    auVar16[8] = -(uStack_50 == uVar25);
    auVar16[9] = -(uStack_4f == uVar26);
    auVar16[10] = -(uStack_4e == uVar27);
    auVar16[0xb] = -(bStack_4d == bVar28);
    auVar16[0xc] = -(uStack_4c == uVar29);
    auVar16[0xd] = -(uStack_4b == uVar30);
    auVar16[0xe] = -(uStack_4a == uVar31);
    auVar16[0xf] = -(bVar7 == bVar32);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
    uVar12 = uVar13;
    bStack_49 = bVar7;
    if (uVar9 != 0) {
      local_78 = ppVar4 + uVar14 * 0xf;
      do {
        uVar5 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        ppVar11 = local_78 + uVar5;
        __s2 = *(char **)((ppVar11->first)._M_target + 8);
        if (__s2 == "N5slang7parsing19PreprocessorOptionsE") goto LAB_001d5d47;
        local_a8 = hash;
        local_a0 = uVar14;
        local_98 = pos0;
        local_90 = uVar13;
        local_88 = sVar10;
        local_80 = (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                    *)this;
        local_68 = uVar17;
        uStack_67 = uVar18;
        uStack_66 = uVar19;
        bStack_65 = bVar20;
        uStack_64 = uVar21;
        uStack_63 = uVar22;
        uStack_62 = uVar23;
        bStack_61 = bVar24;
        uStack_60 = uVar25;
        uStack_5f = uVar26;
        uStack_5e = uVar27;
        bStack_5d = bVar28;
        uStack_5c = uVar29;
        uStack_5b = uVar30;
        uStack_5a = uVar31;
        bStack_59 = bVar32;
        iVar8 = strcmp("N5slang7parsing19PreprocessorOptionsE",__s2);
        if (iVar8 == 0) goto LAB_001d5d47;
        uVar9 = uVar9 - 1 & uVar9;
        this = (Bag *)local_80;
        pos0 = local_98;
        sVar10 = local_88;
        uVar12 = local_90;
        uVar13 = local_90;
        uVar14 = local_a0;
        hash = local_a8;
        uVar17 = local_68;
        uVar18 = uStack_67;
        uVar19 = uStack_66;
        bVar20 = bStack_65;
        uVar21 = uStack_64;
        uVar22 = uStack_63;
        uVar23 = uStack_62;
        bVar24 = bStack_61;
        uVar25 = uStack_60;
        uVar26 = uStack_5f;
        uVar27 = uStack_5e;
        bVar28 = bStack_5d;
        uVar29 = uStack_5c;
        uVar30 = uStack_5b;
        uVar31 = uStack_5a;
        bVar32 = bStack_59;
      } while (uVar9 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar15 & 7] & bVar7) == 0) break;
    uVar13 = uVar12 + 1;
    uVar14 = uVar14 + uVar12 + 1 & sVar10;
  } while (uVar13 <= sVar10);
  if (*(ulong *)((long)this + 0x28) < *(ulong *)((long)this + 0x20)) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,(arrays_type *)this,pos0,hash,&local_b1,&local_b0);
    *(long *)((long)this + 0x28) = *(long *)((long)this + 0x28) + 1;
    ppVar11 = local_48.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::type_index>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,std::any>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::type_index,void>,std::equal_to<std::type_index>,std::allocator<std::pair<std::type_index_const,std::any>>>
                *)this,hash,&local_b1,&local_b0);
    ppVar11 = local_48.p;
  }
LAB_001d5d47:
  std::any::operator=(&ppVar11->second,local_70);
  return;
}

Assistant:

void set(T&& item) {
        items[SLANG_TYPEOF(T)] = std::forward<T>(item);
    }